

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

void CompressBinaryDump(char *file,uint head_size)

{
  int iVar1;
  FILE *pFVar2;
  ulong uVar3;
  void *__ptr;
  void *__ptr_00;
  uint32_t uVar4;
  uint32_t uncompressed_size;
  uLongf out_size;
  
  pFVar2 = fopen(file,"r");
  fseek(pFVar2,0,2);
  uVar3 = ftell(pFVar2);
  fseek(pFVar2,0,0);
  uVar4 = (uint)uVar3 - head_size;
  if ((uint)uVar3 < head_size) {
    fclose(pFVar2);
    return;
  }
  __ptr = operator_new__(uVar3 & 0xffffffff);
  fread(__ptr,1,uVar3 & 0xffffffff,pFVar2);
  uncompressed_size = uVar4;
  out_size = compressBound(uVar4);
  __ptr_00 = operator_new__(out_size);
  iVar1 = compress2(__ptr_00,&out_size,(long)__ptr + (ulong)head_size,uVar4,9);
  if (iVar1 != 0) {
    fwrite("compress2: error\n",0x11,1,_stderr);
  }
  fclose(pFVar2);
  pFVar2 = fopen(file,"w");
  fwrite(__ptr,(ulong)head_size,1,pFVar2);
  fwrite(&uncompressed_size,4,1,pFVar2);
  fwrite(__ptr_00,out_size,1,pFVar2);
  fclose(pFVar2);
  operator_delete__(__ptr);
  operator_delete__(__ptr_00);
  return;
}

Assistant:

void CompressBinaryDump(const char* file, unsigned int head_size)
{
	// for simplicity ... copy the file into memory again and compress it there
	FILE* p = fopen(file,"r");
	fseek(p,0,SEEK_END);
	const uint32_t size = ftell(p);
	fseek(p,0,SEEK_SET);

	if (size<head_size) {
		fclose(p);
		return;
	}

	uint8_t* data = new uint8_t[size];
	fread(data,1,size,p);

	uint32_t uncompressed_size = size-head_size;
	uLongf out_size = (uLongf)compressBound(uncompressed_size);
	uint8_t* out = new uint8_t[out_size];

	int res = compress2(out,&out_size,data+head_size,uncompressed_size,9);
	if(res != Z_OK)
		fprintf(stderr, "compress2: error\n");
	fclose(p);
	p = fopen(file,"w");

	fwrite(data,head_size,1,p);
	fwrite(&uncompressed_size,4,1,p); // write size of uncompressed data
	fwrite(out,out_size,1,p);

	fclose(p);
	delete[] data;
	delete[] out;
}